

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_machine.cpp
# Opt level: O0

void __thiscall
defyx::VmBase<defyx::LargePageAllocator,_false>::~VmBase
          (VmBase<defyx::LargePageAllocator,_false> *this)

{
  undefined8 *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  *in_RDI = &PTR__VmBase_0016bc58;
  LargePageAllocator::freeMemory(in_RDI,in_stack_ffffffffffffffe8);
  defyx_vm::~defyx_vm((defyx_vm *)0x1343de);
  return;
}

Assistant:

VmBase<Allocator, softAes>::~VmBase() {
		Allocator::freeMemory(scratchpad, ScratchpadSize);
	}